

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  void *ptr;
  RepeatedField<long> *this_00;
  uint extraout_EDX;
  undefined1 *puVar4;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  SooRep *unaff_R14;
  Arena *pAStack_70;
  ulong uStack_68;
  SooRep *pSStack_60;
  undefined1 auStack_28 [8];
  undefined8 uStack_20;
  undefined1 local_10 [16];
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == is_soo) {
    if (is_soo) {
      if (3 < size) goto LAB_00144fad;
      (this->field_0).long_rep.elements_int = (long)size | uVar1 & 0xfffffffffffffff8;
    }
    else {
      (this->field_0).long_rep.size = size;
    }
    return;
  }
  uStack_20 = 0x144fad;
  set_size();
  size = extraout_EDX;
LAB_00144fad:
  iVar3 = (int)local_10;
  this_01 = (LongSooRep *)(ulong)(uint)size;
  uStack_20 = 0x144fb9;
  set_size();
  uVar2 = 1;
  if (iVar3 == 0) {
    uVar2 = this_01->capacity;
  }
  if (0 < (int)uVar2) {
    if ((char)iVar3 != '\0') {
      return;
    }
    LongSooRep::elements(this_01);
    return;
  }
  puVar4 = auStack_28;
  this_02 = (SooRep *)(ulong)uVar2;
  RepeatedField<long>::elements();
  if ((int)puVar4 < 0) {
    pSStack_60 = (SooRep *)0x14503a;
    RepeatedField<long>::Mutable();
  }
  else {
    pSStack_60 = (SooRep *)0x14500a;
    iVar3 = SooRep::size(this_02,(undefined1  [16])
                                 ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
    unaff_R14 = this_02;
    if ((int)puVar4 < iVar3) {
      pSStack_60 = (SooRep *)0x145020;
      RepeatedField<long>::elements
                ((RepeatedField<long> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  this_03 = (Arena *)((ulong)puVar4 & 0xffffffff);
  pSStack_60 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  RepeatedField<long>::Mutable();
  uStack_68 = (ulong)puVar4 & 0xffffffff;
  pSStack_60 = unaff_R14;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField<long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_70 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_70);
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }